

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O2

int __thiscall
kj::_::BTreeImpl::verify
          (BTreeImpl *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  Fault f_1;
  DebugComparison<unsigned_long,_unsigned_long_&> _kjCondition;
  Fault local_58;
  DebugComparison<unsigned_long,_unsigned_long_&> local_50;
  EVP_PKEY_CTX *local_28;
  uchar *local_20;
  size_t local_18;
  
  local_28 = ctx;
  local_20 = sig;
  local_18 = siglen;
  local_50.left =
       verifyNode(this,(size_t)ctx,(FunctionParam<bool_(unsigned_int,_unsigned_int)> *)&local_20,0,
                  this->height,(MaybeUint)0x0);
  local_50.op.content.ptr = " == ";
  local_50.op.content.size_ = 5;
  local_50.result = (EVP_PKEY_CTX *)local_50.left == ctx;
  if (local_50.result) {
    return (int)local_50.left;
  }
  local_50.right = (unsigned_long *)&local_28;
  Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long&>&>
            (&local_58,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
             ,0xa8,FAILED,"verifyNode(size, f, 0, height, nullptr) == size","_kjCondition,",
             &local_50);
  Debug::Fault::fatal(&local_58);
}

Assistant:

void BTreeImpl::verify(size_t size, FunctionParam<bool(uint, uint)> f) {
  KJ_ASSERT(verifyNode(size, f, 0, height, nullptr) == size);
}